

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O1

Channel * x11_new_channel(tree234 *authtree,SshChannel *c,char *peeraddr,int peerport,
                         _Bool connection_sharing_possible)

{
  void *pvVar1;
  char *pcVar2;
  undefined3 in_register_00000081;
  
  pcVar2 = (char *)0x0;
  pvVar1 = safemalloc(1,0x80,0);
  *(PlugVtable **)((long)pvVar1 + 0x68) = &X11Connection_plugvt;
  *(ChannelVtable **)((long)pvVar1 + 0x70) = &X11Connection_channelvt;
  *(int *)((long)pvVar1 + 0x78) = CONCAT31(in_register_00000081,connection_sharing_possible) << 7;
  *(tree234 **)((long)pvVar1 + 0x10) = authtree;
  *(undefined1 *)((long)pvVar1 + 0x44) = 0;
  *(undefined4 *)((long)pvVar1 + 0x30) = 0;
  *(undefined2 *)((long)pvVar1 + 0x45) = 0x101;
  *(SshChannel **)((long)pvVar1 + 0x58) = c;
  *(undefined8 *)((long)pvVar1 + 0x18) = 0;
  *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  *(undefined8 *)((long)pvVar1 + 0x60) = 0;
  if (peeraddr != (char *)0x0) {
    pcVar2 = dupstr(peeraddr);
  }
  *(char **)((long)pvVar1 + 0x48) = pcVar2;
  *(int *)((long)pvVar1 + 0x50) = peerport;
  return (Channel *)((long)pvVar1 + 0x70);
}

Assistant:

Channel *x11_new_channel(tree234 *authtree, SshChannel *c,
                         const char *peeraddr, int peerport,
                         bool connection_sharing_possible)
{
    struct X11Connection *xconn;

    /*
     * Open socket.
     */
    xconn = snew(struct X11Connection);
    xconn->plug.vt = &X11Connection_plugvt;
    xconn->chan.vt = &X11Connection_channelvt;
    xconn->chan.initial_fixed_window_size =
        (connection_sharing_possible ? 128 : 0);
    xconn->auth_protocol = NULL;
    xconn->authtree = authtree;
    xconn->verified = false;
    xconn->data_read = 0;
    xconn->input_wanted = true;
    xconn->no_data_sent_to_x_client = true;
    xconn->c = c;

    /*
     * We don't actually open a local socket to the X server just yet,
     * because we don't know which one it is. Instead, we'll wait
     * until we see the incoming authentication data, which may tell
     * us what display to connect to, or whether we have to divert
     * this X forwarding channel to a connection-sharing downstream
     * rather than handling it ourself.
     */
    xconn->disp = NULL;
    xconn->s = NULL;

    /*
     * Stash the peer address we were given in its original text form.
     */
    xconn->peer_addr = peeraddr ? dupstr(peeraddr) : NULL;
    xconn->peer_port = peerport;

    return &xconn->chan;
}